

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O3

int __thiscall lattice::graph::init(graph *this,EVP_PKEY_CTX *ctx)

{
  long *plVar1;
  pointer pMVar2;
  pointer pMVar3;
  pointer extraout_RAX;
  pointer pbVar4;
  invalid_argument *this_00;
  supercell *in_RCX;
  size_t *in_RDX;
  ulong uVar5;
  pointer pbVar6;
  long lVar7;
  size_t sVar8;
  undefined1 in_R8B;
  undefined7 in_register_00000081;
  pointer pMVar9;
  ulong uVar10;
  size_t index;
  size_t sVar11;
  bool bVar12;
  offset_t cell_offset;
  coordinate_t pos;
  void *local_98 [2];
  long *local_88 [2];
  pair<unsigned_long,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> local_78;
  long *local_58;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  sVar11 = *in_RDX;
  if ((sVar11 != in_RCX->dim_) ||
     (sVar11 != *(long *)(CONCAT71(in_register_00000081,in_R8B) + 8) -
                *(long *)CONCAT71(in_register_00000081,in_R8B) >> 2)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"dimension mismatch");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this->dim_ = sVar11;
  std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::_M_erase_at_end
            (&this->sites_,
             (this->sites_).
             super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>.
             _M_impl.super__Vector_impl_data._M_start);
  pMVar2 = (this->coordinates_).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (this->coordinates_).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar9 = pMVar2;
  if (pMVar3 != pMVar2) {
    do {
      free((pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
          );
      pMVar9 = pMVar9 + 1;
    } while (pMVar9 != pMVar3);
    (this->coordinates_).
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar2;
  }
  pbVar4 = (this->bonds_).
           super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->bonds_).
      super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
      super__Vector_impl_data._M_finish != pbVar4) {
    (this->bonds_).
    super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
    super__Vector_impl_data._M_finish = pbVar4;
  }
  if (in_RCX->num_cells_ != 0) {
    uVar5 = 0;
    do {
      supercell::offset((supercell *)local_98,(size_t)in_RCX);
      if (in_RDX[2] != in_RDX[1]) {
        lVar7 = 0;
        uVar10 = 0;
        do {
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                    (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)ctx);
          local_58 = (long *)(in_RDX[1] + lVar7);
          local_78.second.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows = (Index)local_98;
          local_78.first = (unsigned_long)&local_48;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,double>,Eigen::Matrix<long,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,0>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_88,
                     (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                      *)&local_78);
          free(local_48.m_data);
          add_site(this,(coordinate_t *)local_88,*(int *)(in_RDX[1] + 0x10 + lVar7));
          free(local_88[0]);
          uVar10 = uVar10 + 1;
          lVar7 = lVar7 + 0x18;
        } while (uVar10 < (ulong)(((long)(in_RDX[2] - in_RDX[1]) >> 3) * -0x5555555555555555));
      }
      free(local_98[0]);
      uVar5 = uVar5 + 1;
      sVar11 = in_RCX->num_cells_;
    } while (uVar5 < sVar11);
    pbVar4 = extraout_RAX;
    if (sVar11 != 0) {
      pbVar4 = (pointer)in_RDX[4];
      pbVar6 = (pointer)in_RDX[5];
      index = 0;
      do {
        bVar12 = pbVar6 != pbVar4;
        pbVar6 = pbVar4;
        if (bVar12) {
          uVar5 = 0;
          do {
            plVar1 = (long *)((long)pbVar4 + uVar5 * 0x28);
            sVar11 = ((long)(in_RDX[2] - in_RDX[1]) >> 3) * index * -0x5555555555555555 + *plVar1;
            supercell::add_offset(&local_78,in_RCX,index,(offset_t *)(plVar1 + 2));
            plVar1 = local_78.second.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            if (this->dim_ == 0) {
LAB_0010365f:
              sVar8 = local_78.first * -0x5555555555555555 * ((long)(in_RDX[2] - in_RDX[1]) >> 3) +
                      *(long *)(in_RDX[4] + 8 + uVar5 * 0x28);
              if (sVar11 != sVar8) {
                add_bond(this,sVar11,sVar8,*(int *)(in_RDX[4] + uVar5 * 0x28 + 0x20));
              }
            }
            else {
              bVar12 = true;
              sVar8 = 0;
              do {
                if (*(int *)(*(long *)CONCAT71(in_register_00000081,in_R8B) + sVar8 * 4) == 0) {
                  bVar12 = (bool)(bVar12 & (double)local_78.second.
                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data[sVar8] == 0.0);
                }
                sVar8 = sVar8 + 1;
              } while (this->dim_ != sVar8);
              if (bVar12) goto LAB_0010365f;
            }
            free(plVar1);
            uVar5 = uVar5 + 1;
            pbVar4 = (pointer)in_RDX[4];
          } while (uVar5 < (ulong)(((long)in_RDX[5] - (long)pbVar4 >> 3) * -0x3333333333333333));
          sVar11 = in_RCX->num_cells_;
          pbVar6 = (pointer)in_RDX[5];
        }
        index = index + 1;
      } while (index < sVar11);
    }
  }
  return (int)pbVar4;
}

Assistant:

void init(const basis& bs, const unitcell& cell, const supercell& super,
            const std::vector<boundary_t>& boundary) {
    if (cell.dimension() != super.dimension() || cell.dimension() != boundary.size())
      throw std::invalid_argument("dimension mismatch");

    dim_ = cell.dimension();
    sites_.clear();
    coordinates_.clear();
    bonds_.clear();

    for (std::size_t c = 0; c < super.num_cells(); ++c) {
      auto cell_offset = super.offset(c);
      for (std::size_t t = 0; t < cell.num_sites(); ++t) {
        coordinate_t pos = bs.basis_vectors() *
          (cell_offset.cast<double>() + cell.site(t).coordinate);
        add_site(pos, cell.site(t).type);
      }
    }
    for (std::size_t c = 0; c < super.num_cells(); ++c) {
      for (std::size_t u = 0; u < cell.num_bonds(); ++u) {
        std::size_t s = c * cell.num_sites() + cell.bond(u).source;
        std::size_t target_cell;
        offset_t cross;
        std::tie(target_cell, cross) = super.add_offset(c, cell.bond(u).target_offset);
        bool valid = true;
        for (std::size_t m = 0; m < dim_; ++m)
          if (boundary[m] == boundary_t::open && cross(m) != 0) valid = false;
        if (valid) {
          std::size_t t = target_cell * cell.num_sites() + cell.bond(u).target;
          if (s != t) add_bond(s, t, cell.bond(u).type);
        }
      }
    }
  }